

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall Context::~Context(Context *this)

{
  Context *this_local;
  
  ~Context(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Context::~Context()
{
}